

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

bool __thiscall SAT::simplify(SAT *this,Clause *c)

{
  bool bVar1;
  uint uVar2;
  Lit *pLVar3;
  Clause *in_RSI;
  undefined8 in_RDI;
  uint j;
  uint i;
  int in_stack_ffffffffffffff9c;
  Clause *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar4;
  lbool local_3e;
  int8_t local_3d;
  int local_3c;
  lbool local_35;
  uint local_34;
  uint local_30;
  int8_t local_29;
  int local_28;
  lbool local_22;
  int8_t local_21;
  int local_20;
  lbool local_19;
  Clause *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  pLVar3 = Clause::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  local_20 = pLVar3->x;
  local_19 = value((SAT *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (Lit)(int)in_RDI);
  local_21 = ::l_True.value;
  bVar1 = lbool::operator==(&local_19,::l_True);
  if (bVar1) {
    local_1 = true;
  }
  else {
    pLVar3 = Clause::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_28 = pLVar3->x;
    local_22 = value((SAT *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (Lit)(int)in_RDI);
    local_29 = ::l_True.value;
    bVar1 = lbool::operator==(&local_22,::l_True);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_34 = 2;
      local_30 = 2;
      while (uVar4 = local_30, uVar2 = Clause::size(local_18), uVar4 < uVar2) {
        pLVar3 = Clause::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        local_3c = pLVar3->x;
        local_35 = value((SAT *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),(Lit)(int)in_RDI);
        local_3d = ::l_True.value;
        bVar1 = lbool::operator==(&local_35,::l_True);
        if (bVar1) {
          return true;
        }
        Clause::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        local_3e = value((SAT *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),(Lit)(int)in_RDI);
        bVar1 = lbool::operator==(&local_3e,::l_Undef);
        if (bVar1) {
          in_stack_ffffffffffffffa0 =
               (Clause *)Clause::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          local_34 = local_34 + 1;
          pLVar3 = Clause::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          pLVar3->x = *(int *)in_stack_ffffffffffffffa0;
        }
        local_30 = local_30 + 1;
      }
      Clause::resize(local_18,local_34);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SAT::simplify(Clause& c) const {
	if (value(c[0]) == l_True) {
		return true;
	}
	if (value(c[1]) == l_True) {
		return true;
	}
	unsigned int i;
	unsigned int j;
	for (i = j = 2; i < c.size(); i++) {
		if (value(c[i]) == l_True) {
			return true;
		}
		if (value(c[i]) == l_Undef) {
			c[j++] = c[i];
		}
	}
	c.resize(j);
	return false;
}